

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_socket_comm.c
# Opt level: O2

int tpm_socket_send(TPM_SOCKET_HANDLE handle,uchar *tpm_bytes,uint32_t bytes_len)

{
  LOGGER_LOG p_Var1;
  ssize_t sVar2;
  uint32_t uVar3;
  int iVar4;
  int sent_bytes;
  uint uVar5;
  char *pIterator;
  
  if (bytes_len == 0 || (tpm_bytes == (uchar *)0x0 || handle == (TPM_SOCKET_HANDLE)0x0)) {
    p_Var1 = xlogging_get_log_function();
    iVar4 = 0x124;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_socket_comm.c"
                ,"tpm_socket_send",0x123,1,
                "Invalid argument specified handle: %p, tpm_bytes: %p, bytes_len: %d",handle,
                tpm_bytes,(ulong)bytes_len);
    }
  }
  else {
    sVar2 = 0;
    for (uVar3 = bytes_len; uVar5 = (uint)sVar2, 0 < (int)uVar3; uVar3 = uVar3 - uVar5) {
      sVar2 = send(handle->socket_conn,tpm_bytes,(ulong)uVar3,0);
      uVar5 = (uint)sVar2;
      if ((int)uVar5 < 1) {
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_socket_comm.c"
                    ,"send_socket_bytes",0x89,1,"Failure sending packet.");
        }
        break;
      }
      tpm_bytes = tpm_bytes + (uVar5 & 0x7fffffff);
    }
    iVar4 = 0;
    if ((int)uVar5 < (int)bytes_len) {
      p_Var1 = xlogging_get_log_function();
      iVar4 = 0x92;
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_socket_comm.c"
                  ,"send_socket_bytes",0x91,1,"sent byte amoutn is less than desired send amount.");
      }
    }
  }
  return iVar4;
}

Assistant:

int tpm_socket_send(TPM_SOCKET_HANDLE handle, const unsigned char* tpm_bytes, uint32_t bytes_len)
{
    int result;
    if (handle == NULL || tpm_bytes == NULL || bytes_len == 0)
    {
        LogError("Invalid argument specified handle: %p, tpm_bytes: %p, bytes_len: %d", handle, tpm_bytes, bytes_len);
        result = MU_FAILURE;
    }
    else
    {
        result = send_socket_bytes(handle, tpm_bytes, bytes_len);
    }
    return result;
}